

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material_palette.c
# Opt level: O0

void prf_material_palette_entry_f(prf_node_t *node,prf_state_t *state)

{
  long in_RSI;
  ushort *in_RDI;
  
  if (*in_RDI == prf_material_palette_info.opcode) {
    if ((*(long *)(in_RSI + 0x28) == 0) || (*(ushort **)(in_RSI + 0x28) == in_RDI)) {
      *(ushort **)(in_RSI + 0x28) = in_RDI;
    }
    else {
      prf_error(9,"material palette entry: already registered a material palette");
    }
  }
  else {
    prf_error(9,"tried material palette entry method on node of type %d.",(ulong)*in_RDI);
  }
  return;
}

Assistant:

static
void
prf_material_palette_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );

    if ( node->opcode != prf_material_palette_info.opcode ) {
        prf_error( 9, "tried material palette entry method on node of type %d.",
            node->opcode );
        return;
    }

    if ( state->material_palette != NULL && state->material_palette != node ) {
        prf_error( 9,
            "material palette entry: already registered a material palette" );
        return;
    }

    state->material_palette = node;
}